

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction
          (LoopUnrollerUtilsImpl *this,BasicBlock *insert_point)

{
  Function *pFVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer puVar4;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> local_38;
  
  pFVar1 = this->function_;
  local_38.container_ = &pFVar1->blocks_;
  puVar4 = (pFVar1->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    local_38.iterator_._M_current = puVar4;
    if ((pFVar1 == this->function_) &&
       (puVar4 == (this->function_->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) break;
    uVar2 = BasicBlock::id((puVar4->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
    uVar3 = BasicBlock::id(insert_point);
    puVar4 = puVar4 + 1;
    if (uVar2 == uVar3) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                (&local_38,&this->blocks_to_add_);
      return;
    }
  }
  __assert_fail("false && \"Could not add basic blocks to function as insert point was not found.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                ,0x358,
                "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::AddBlocksToFunction(const BasicBlock *)"
               );
}

Assistant:

void LoopUnrollerUtilsImpl::AddBlocksToFunction(
    const BasicBlock* insert_point) {
  for (auto basic_block_iterator = function_.begin();
       basic_block_iterator != function_.end(); ++basic_block_iterator) {
    if (basic_block_iterator->id() == insert_point->id()) {
      basic_block_iterator.InsertBefore(&blocks_to_add_);
      return;
    }
  }

  assert(
      false &&
      "Could not add basic blocks to function as insert point was not found.");
}